

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O3

sub_string parse_token(sub_string *text)

{
  byte bVar1;
  bool bVar2;
  char *begin;
  char *pcVar3;
  byte *pbVar4;
  http_parsing_error *this;
  sub_string local_30;
  
  begin = sub_string::begin(text);
  bVar2 = sub_string::empty(text);
  while (!bVar2) {
    pbVar4 = (byte *)sub_string::operator[](text,0);
    bVar1 = *pbVar4;
    if ((((char)bVar1 < '!') ||
        ((bVar1 - 0x22 < 0x3c && ((0xe0000007f0024c1U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0)))
        ) || ((bVar1 - 0x7b < 5 && ((0x15U >> (bVar1 - 0x7b & 0x1f) & 1) != 0)))) break;
    sub_string::advance(text,1);
    bVar2 = sub_string::empty(text);
  }
  pcVar3 = sub_string::begin(text);
  if (begin != pcVar3) {
    pcVar3 = sub_string::begin(text);
    sub_string::sub_string(&local_30,begin,pcVar3);
    return local_30;
  }
  this = (http_parsing_error *)__cxa_allocate_exception(0x10);
  http_parsing_error::http_parsing_error(this,"invalid token");
  __cxa_throw(this,&http_parsing_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

sub_string parse_token(sub_string& text)
{
    // token          = 1*<any CHAR except CTLs or separators>
    // separators     = "(" | ")" | "<" | ">" | "@"
    //                | "," | ";" | ":" | "\" | <">
    //                | "/" | "[" | "]" | "?" | "="
    //                | "{" | "}" | SP | HT
    // CTL            = <any US-ASCII control character
    //                  (octets 0 - 31) and DEL (127)>
    // HT             = <US-ASCII HT, horizontal-tab (9)>

    char const* start = text.begin();

    for (;;)
    {
        if (text.empty())
            break;
        char c = text[0];
        if (c <= ' '
         || c == '(' || c == ')' || c == '<' || c == '>' || c == '@'
         || c == ',' || c == ';' || c == ':' || c == '\\' || c == '"'
         || c == '/' || c == '[' || c == ']' || c == '?' || c == '='
         || c == '{' || c == '}' || c == '\x7f')
            break;

        text.advance(1);
    }

    if (start == text.begin())
        throw http_parsing_error("invalid token");

    return sub_string{start, text.begin()};
}